

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor.cpp
# Opt level: O3

int __thiscall
booster::aio::epoll_reactor::poll(epoll_reactor *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int __maxevents;
  uint uVar4;
  ulong uVar5;
  int *in_R8;
  uint uVar6;
  epoll_event fds [128];
  epoll_event local_638 [96];
  
  memset(local_638,0,0x600);
  __maxevents = 0x80;
  if ((int)__nfds < 0x80) {
    __maxevents = (int)__nfds;
  }
  uVar2 = epoll_wait(this->pollfd_,local_638,__maxevents,__timeout);
  if ((int)uVar2 < 0) {
    piVar3 = __errno_location();
    *in_R8 = *piVar3;
    uVar4 = 0xffffffff;
  }
  else {
    uVar4 = 0;
    if (uVar2 != 0) {
      piVar3 = (int *)&local_638[0].field_0x4;
      uVar5 = 0;
      do {
        uVar4 = piVar3[-1];
        uVar6 = uVar4 >> 1 & 2;
        uVar1 = uVar6 + 4;
        if ((uVar4 & 0x1a) == 0) {
          uVar1 = uVar6;
        }
        *(uint *)&__fds[uVar5].events = uVar1 + (uVar4 & 1);
        __fds[uVar5].fd = *piVar3;
        uVar5 = uVar5 + 1;
        piVar3 = piVar3 + 3;
        uVar4 = uVar2;
      } while (uVar2 != uVar5);
    }
  }
  return uVar4;
}

Assistant:

virtual int poll(reactor::event *events,int n,int timeout,int &error)
		{
			struct epoll_event fds[128] = {};
			if (n >128) n=128;

			int size = 0;
			size = ::epoll_wait(pollfd_,fds,n,timeout);
			
			if(size < 0) {
				error = errno;
				return -1;
			}
			int read = 0;
			for(int i=0;i<size;i++) {
				events[read].events = to_user_events(fds[i].events);
				events[read].fd = fds[i].data.fd; 
				read ++;
			}
			return read;
		}